

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

void __thiscall QGridLayoutPrivate::setupHfwLayoutData(QGridLayoutPrivate *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int start;
  QList<QLayoutStruct> *this_00;
  QLayoutStruct *pQVar3;
  QGridBox *this_01;
  int end;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  pointer pQVar9;
  int extraout_var;
  int extraout_var_00;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint width;
  long lVar13;
  int sizeHint;
  bool bVar14;
  
  this_00 = this->hfwData;
  if (0 < this->rr) {
    lVar11 = 0;
    lVar13 = 0;
    do {
      pQVar3 = (this->rowData).d.ptr;
      pQVar9 = QList<QLayoutStruct>::data(this_00);
      puVar1 = (undefined8 *)((long)&pQVar3->stretch + lVar11);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pQVar3->spacing + lVar11);
      uVar5 = *puVar2;
      uVar6 = puVar2[1];
      puVar2 = (undefined8 *)((long)&pQVar9->stretch + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      puVar1 = (undefined8 *)((long)&pQVar9->spacing + lVar11);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      iVar10 = (this->rMinHeights).d.ptr[lVar13];
      pQVar9 = QList<QLayoutStruct>::data(this_00);
      *(int *)((long)&pQVar9->sizeHint + lVar11) = iVar10;
      pQVar9 = QList<QLayoutStruct>::data(this_00);
      *(int *)((long)&pQVar9->minimumSize + lVar11) = iVar10;
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar13 < this->rr);
  }
  iVar10 = 0;
  do {
    if ((this->things).d.size != 0) {
      uVar12 = 0;
      do {
        this_01 = (this->things).d.ptr[uVar12];
        start = this_01->row;
        end = this->rr + -1;
        if (-1 < this_01->torow) {
          end = this_01->torow;
        }
        iVar7 = this->cc + -1;
        if (-1 < this_01->tocol) {
          iVar7 = this_01->tocol;
        }
        pQVar3 = (this->colData).d.ptr;
        width = (pQVar3[iVar7].size + pQVar3[iVar7].pos) - pQVar3[this_01->col].pos;
        if (start == end) {
          if (iVar10 == 0) {
            addHfwData(this,this_01,width);
          }
        }
        else if (iVar10 == 0) {
          initEmptyMultiBox(this_00,start,end);
        }
        else {
          (*this_01->item_->_vptr_QLayoutItem[2])();
          (*this_01->item_->_vptr_QLayoutItem[3])();
          iVar8 = (*this_01->item_->_vptr_QLayoutItem[9])();
          iVar7 = extraout_var_00;
          sizeHint = extraout_var;
          if ((char)iVar8 != '\0') {
            iVar8 = (*this_01->item_->_vptr_QLayoutItem[10])(this_01->item_,(ulong)width);
            sizeHint = extraout_var;
            if (extraout_var < iVar8) {
              sizeHint = iVar8;
            }
            iVar7 = extraout_var_00;
            if (extraout_var_00 < iVar8) {
              iVar7 = iVar8;
            }
          }
          iVar8 = QGridBox::vStretch(this_01);
          distributeMultiBox(this_00,start,end,iVar7,sizeHint,&this->rStretch,iVar8);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)(this->things).d.size);
    }
    bVar14 = iVar10 == 0;
    iVar10 = iVar10 + 1;
  } while (bVar14);
  if (0 < this->rr) {
    lVar11 = 0x14;
    lVar13 = 0;
    do {
      pQVar3 = (this_00->d).ptr;
      bVar14 = true;
      if (*(char *)((long)&pQVar3->stretch + lVar11) == '\0') {
        bVar14 = 0 < *(int *)((long)pQVar3 + lVar11 + -0x14);
      }
      pQVar9 = QList<QLayoutStruct>::data(this_00);
      *(bool *)((long)&pQVar9->stretch + lVar11) = bVar14;
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar13 < this->rr);
  }
  return;
}

Assistant:

void QGridLayoutPrivate::setupHfwLayoutData()
{
    QList<QLayoutStruct> &rData = *hfwData;
    for (int i = 0; i < rr; i++) {
        rData[i] = rowData.at(i);
        rData[i].minimumSize = rData[i].sizeHint = rMinHeights.at(i);
    }

    for (int pass = 0; pass < 2; ++pass) {
        for (int i = 0; i < things.size(); ++i) {
            QGridBox *box = things.at(i);
            int r1 = box->row;
            int c1 = box->col;
            int r2 = box->toRow(rr);
            int c2 = box->toCol(cc);
            int w = colData.at(c2).pos + colData.at(c2).size - colData.at(c1).pos;

            if (r1 == r2) {
                if (pass == 0)
                    addHfwData(box, w);
            } else {
                if (pass == 0) {
                    initEmptyMultiBox(rData, r1, r2);
                } else {
                    QSize hint = box->sizeHint();
                    QSize min = box->minimumSize();
                    if (box->hasHeightForWidth()) {
                        int hfwh = box->heightForWidth(w);
                        if (hfwh > hint.height())
                            hint.setHeight(hfwh);
                        if (hfwh > min.height())
                            min.setHeight(hfwh);
                    }
                    distributeMultiBox(rData, r1, r2, min.height(), hint.height(),
                                       rStretch, box->vStretch());
                }
            }
        }
    }
    for (int i = 0; i < rr; i++)
        rData[i].expansive = rData.at(i).expansive || rData.at(i).stretch > 0;
}